

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QByteArray * QTzTimeZonePrivate::staticSystemTimeZoneId(void)

{
  StatIdent *pSVar1;
  undefined1 *puVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  Data *pDVar5;
  bool bVar6;
  undefined8 *puVar7;
  int *piVar8;
  long lVar9;
  qsizetype qVar10;
  ulong uVar11;
  long lVar12;
  unsigned_long uVar13;
  char *pcVar14;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView str;
  StatIdent SVar15;
  StatIdent SVar16;
  StatIdent SVar17;
  ulong local_e8;
  ulong local_e0;
  QArrayDataPointer<char> local_d8;
  QArrayDataPointer<char> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv(in_RDI,"TZ");
  local_58.d = (Data *)0x53908a;
  bVar6 = ::operator==(in_RDI,(char **)&local_58);
  if (bVar6) {
    QByteArray::clear(in_RDI);
LAB_003b0715:
    if ((in_RDI->d).size != 0) goto LAB_003b0b91;
  }
  else if ((in_RDI->d).size != 0) {
    if (*(in_RDI->d).ptr == ':') {
      QByteArray::sliced((QByteArray *)&local_58,in_RDI,1);
      pDVar3 = (in_RDI->d).d;
      pcVar4 = (char16_t *)(in_RDI->d).ptr;
      (in_RDI->d).d = (Data *)local_58.d;
      (in_RDI->d).ptr = (char *)local_58.ptr;
      puVar2 = (undefined1 *)(in_RDI->d).size;
      (in_RDI->d).size = local_58.size;
      local_58.d = (Data *)pDVar3;
      local_58.ptr = pcVar4;
      local_58.size = (qsizetype)puVar2;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    }
    goto LAB_003b0715;
  }
  puVar7 = (undefined8 *)__tls_get_addr(&PTR_00674338);
  if (*(char *)((long)puVar7 + 0x99) == '\0') {
    __cxa_thread_atexit(anon_unknown.dwarf_1242596::ZoneNameReader::~ZoneNameReader,puVar7,
                        &__dso_handle);
    *(undefined1 *)((long)puVar7 + 0x99) = 1;
  }
  SVar15 = anon_unknown.dwarf_1242596::ZoneNameReader::identify("/etc/localtime");
  SVar16 = anon_unknown.dwarf_1242596::ZoneNameReader::identify("/etc/TZ");
  uVar13 = SVar16.m_ino;
  SVar17 = anon_unknown.dwarf_1242596::ZoneNameReader::identify("/etc/timezone");
  lVar12 = puVar7[2];
  if (lVar12 == 0) {
LAB_003b07e5:
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable((QString *)&local_58,"TZDIR");
    local_78.d = (Data *)0x0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_78.ptr = L"/etc/localtime";
    local_98.size = 0;
    local_78.size = 0xe;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    piVar8 = __errno_location();
    *piVar8 = 0;
    lVar9 = sysconf(0xad);
    lVar12 = 0x14;
    if (-1 < lVar9) {
      lVar12 = lVar9;
    }
    do {
      local_e8 = SVar17.m_ino;
      local_e0 = SVar17.m_dev;
      QFile::symLinkTarget((QString *)&local_98,(QString *)&local_78);
      qVar10 = local_78.size;
      pcVar4 = local_78.ptr;
      pDVar5 = local_78.d;
      local_78.d = local_98.d;
      local_78.ptr = local_98.ptr;
      local_98.d = pDVar5;
      local_98.ptr = pcVar4;
      local_78.size = local_98.size;
      local_98.size = qVar10;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
        qVar10 = QString::indexOf((QString *)&local_78,(QString *)&local_58,0,CaseSensitive);
        if (-1 < (int)(uint)qVar10) {
          local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.ptr = (char *)(local_78.ptr +
                                 (long)(local_58.size + (ulong)((uint)qVar10 & 0x7fffffff)));
          local_b8.d = (Data *)(local_78.size +
                               -(long)(local_58.size + (ulong)((uint)qVar10 & 0x7fffffff)));
          QStringView::toUtf8((QByteArray *)&local_98,(QStringView *)&local_b8);
          if (((undefined1 *)local_98.size == (undefined1 *)0x0) || ((char)*local_98.ptr != '/')) {
            local_b8.d = (Data *)local_98.d;
            local_b8.ptr = (char *)local_98.ptr;
            local_b8.size = local_98.size;
            if (local_98.d != (Data *)0x0) {
              LOCK();
              ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
          }
          else {
            QByteArray::sliced((QByteArray *)&local_b8,(QByteArray *)&local_98,1);
          }
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
          goto LAB_003b0a3b;
        }
      }
      str.m_data = "/zoneinfo/";
      str.m_size = 10;
      qVar10 = QString::indexOf((QString *)&local_78,str,0,CaseSensitive);
      if (-1 < (int)(uint)qVar10) {
        uVar11 = (ulong)((uint)qVar10 & 0x7fffffff);
        local_98.ptr = local_78.ptr + uVar11 + 10;
        local_98.d = (Data *)(local_78.size + -(uVar11 + 10));
        QStringView::toUtf8((QByteArray *)&local_b8,(QStringView *)&local_98);
        goto LAB_003b0a3b;
      }
    } while (((undefined1 *)local_78.size != (undefined1 *)0x0) &&
            (bVar6 = 1 < lVar12, lVar12 = lVar12 + -1, bVar6));
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char *)0x0;
    local_b8.size = 0;
LAB_003b0a3b:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    pDVar5 = (Data *)*puVar7;
    pcVar4 = (char16_t *)puVar7[1];
    *puVar7 = local_b8.d;
    puVar7[1] = local_b8.ptr;
    puVar2 = (undefined1 *)puVar7[2];
    puVar7[2] = local_b8.size;
    local_b8.d = (Data *)pDVar5;
    local_b8.ptr = (char *)pcVar4;
    local_b8.size = (qsizetype)puVar2;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
    lVar12 = puVar7[2];
    if (lVar12 == 0) {
      local_78.d = (Data *)0x0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_78.ptr = L"/etc/TZ";
      local_98.size = 0;
      local_78.size = 7;
      anon_unknown.dwarf_1242596::ZoneNameReader::etcContent
                ((QByteArray *)&local_58,(QString *)&local_78);
      pDVar3 = (Data *)*puVar7;
      pcVar4 = (char16_t *)puVar7[1];
      *puVar7 = local_58.d;
      puVar7[1] = local_58.ptr;
      puVar2 = (undefined1 *)puVar7[2];
      puVar7[2] = local_58.size;
      local_58.d = (Data *)pDVar3;
      local_58.ptr = pcVar4;
      local_58.size = (qsizetype)puVar2;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      lVar12 = puVar7[2];
      if (lVar12 == 0) {
        local_78.d = (Data *)0x0;
        local_98.d = (Data *)0x0;
        local_98.ptr = (char16_t *)0x0;
        local_78.ptr = L"/etc/timezone";
        local_98.size = 0;
        local_78.size = 0xd;
        anon_unknown.dwarf_1242596::ZoneNameReader::etcContent
                  ((QByteArray *)&local_58,(QString *)&local_78);
        pDVar3 = (Data *)*puVar7;
        pcVar4 = (char16_t *)puVar7[1];
        *puVar7 = local_58.d;
        puVar7[1] = local_58.ptr;
        puVar2 = (undefined1 *)puVar7[2];
        puVar7[2] = local_58.size;
        local_58.d = (Data *)pDVar3;
        local_58.ptr = pcVar4;
        local_58.size = (qsizetype)puVar2;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        local_d8.d = (Data *)*puVar7;
        lVar12 = puVar7[2];
        puVar7[3] = local_e0 | -(ulong)(lVar12 == 0);
        puVar7[4] = -(ulong)(lVar12 == 0) | local_e8;
        pcVar14 = (char *)puVar7[1];
        goto LAB_003b0b55;
      }
      puVar7[3] = SVar16.m_dev;
    }
    else {
      puVar7[3] = SVar15.m_dev;
      uVar13 = SVar15.m_ino;
    }
    puVar7[4] = uVar13;
    local_d8.d = (Data *)*puVar7;
    pcVar14 = (char *)puVar7[1];
  }
  else {
    pSVar1 = (StatIdent *)(puVar7 + 3);
    if (((pSVar1->m_dev & puVar7[4]) == 0xffffffffffffffff) ||
       (((SVar15 != *pSVar1 && (SVar16 != *pSVar1)) && (SVar17 != *pSVar1)))) goto LAB_003b07e5;
    local_d8.d = (Data *)*puVar7;
    pcVar14 = (char *)puVar7[1];
  }
LAB_003b0b55:
  if (local_d8.d != (Data *)0x0) {
    LOCK();
    ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = (in_RDI->d).d;
  local_d8.ptr = (in_RDI->d).ptr;
  (in_RDI->d).d = local_d8.d;
  (in_RDI->d).ptr = pcVar14;
  local_d8.size = (in_RDI->d).size;
  (in_RDI->d).size = lVar12;
  local_d8.d = pDVar3;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_d8);
LAB_003b0b91:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QByteArray QTzTimeZonePrivate::staticSystemTimeZoneId()
{
    // Check TZ env var first, if not populated try find it
    QByteArray ianaId = qgetenv("TZ");

    // The TZ value can be ":/etc/localtime" which libc considers
    // to be a "default timezone", in which case it will be read
    // by one of the blocks below, so unset it here so it is not
    // considered as a valid/found ianaId
    if (ianaId == ":/etc/localtime")
        ianaId.clear();
    else if (ianaId.startsWith(':'))
        ianaId = ianaId.sliced(1);

    if (ianaId.isEmpty()) {
        Q_CONSTINIT thread_local static ZoneNameReader reader;
        ianaId = reader.name();
    }

    return ianaId;
}